

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLWriter.cpp
# Opt level: O3

Writer * __thiscall xe::xml::Writer::operator<<(Writer *this,Attribute *attribute)

{
  ostream *poVar1;
  
  poVar1 = this->m_rawDst;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(attribute->name)._M_dataplus._M_p,(attribute->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"=\"",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(attribute->value)._M_dataplus._M_p,(attribute->value)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  return this;
}

Assistant:

Writer& Writer::operator<< (const Attribute& attribute)
{
	DE_ASSERT(m_state == STATE_ELEMENT);

	// \todo [2012-09-05 pyry] Escape?
	m_rawDst << " " << attribute.name << "=\"" << attribute.value << "\"";

	return *this;
}